

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode bundle_add_conn(connectbundle *cb_ptr,connectdata *conn)

{
  connectdata *conn_local;
  connectbundle *cb_ptr_local;
  
  Curl_llist_insert_next(&cb_ptr->conn_list,(cb_ptr->conn_list).tail,conn,&conn->bundle_node);
  conn->bundle = cb_ptr;
  cb_ptr->num_connections = cb_ptr->num_connections + 1;
  return CURLE_OK;
}

Assistant:

static CURLcode bundle_add_conn(struct connectbundle *cb_ptr,
                                struct connectdata *conn)
{
  Curl_llist_insert_next(&cb_ptr->conn_list, cb_ptr->conn_list.tail, conn,
                         &conn->bundle_node);
  conn->bundle = cb_ptr;
  cb_ptr->num_connections++;
  return CURLE_OK;
}